

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O1

void arg_log_r(ps_config_t *cmdln,ps_arg_t *defn,int32 doc,int32 lineno)

{
  undefined8 *puVar1;
  size_t sVar2;
  void *__base;
  size_t sVar3;
  cmd_ln_val_t *pcVar4;
  char *pcVar5;
  char *fmt;
  int iVar6;
  uint uVar7;
  ps_arg_t *ppVar8;
  size_t n_elem;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  
  pcVar5 = defn->name;
  if (pcVar5 == (char *)0x0) {
    iVar9 = 0;
    uVar12 = 4;
    uVar7 = 4;
  }
  else {
    ppVar8 = defn + 1;
    iVar9 = 0;
    iVar10 = 0;
    iVar6 = 0;
    do {
      sVar2 = strlen(pcVar5);
      iVar11 = (int)sVar2 + 1;
      if (iVar11 < iVar10) {
        iVar11 = iVar10;
      }
      iVar10 = iVar11;
      if (ppVar8[-1].deflt == (char *)0x0) {
        iVar11 = 6;
      }
      else {
        sVar2 = strlen(ppVar8[-1].deflt);
        iVar11 = (int)sVar2;
      }
      if (iVar6 <= iVar11) {
        iVar6 = iVar11;
      }
      pcVar5 = ppVar8->name;
      iVar9 = iVar9 + 1;
      ppVar8 = ppVar8 + 1;
    } while (pcVar5 != (char *)0x0);
    uVar12 = iVar10 + 4;
    uVar7 = iVar6 + 4;
  }
  err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)uVar12,"[NAME]");
  err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)uVar7,"[DEFLT]");
  pcVar5 = "     [DESCR]\n";
  if (doc == 0) {
    pcVar5 = "    [VALUE]\n";
  }
  err_msg(ERR_INFO,(char *)0x0,0,pcVar5);
  n_elem = (size_t)iVar9;
  __base = __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                          ,0x85);
  if (0 < iVar9) {
    sVar3 = 0;
    do {
      *(ps_arg_t **)((long)__base + sVar3 * 8) = defn;
      sVar3 = sVar3 + 1;
      defn = defn + 1;
    } while (n_elem != sVar3);
  }
  qsort(__base,n_elem,8,cmp_name);
  if (0 < iVar9) {
    sVar3 = 0;
    do {
      err_msg(ERR_INFO,(char *)0x0,0,"-%-*s",(ulong)uVar12,
              **(undefined8 **)((long)__base + sVar3 * 8));
      pcVar5 = *(char **)(*(long *)((long)__base + sVar3 * 8) + 0x10);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "";
      }
      err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)uVar7,pcVar5);
      puVar1 = *(undefined8 **)((long)__base + sVar3 * 8);
      if (doc == 0) {
        pcVar4 = cmd_ln_access_r(cmdln,(char *)*puVar1);
        if (pcVar4 != (cmd_ln_val_t *)0x0) {
          switch(*(undefined4 *)(*(long *)((long)__base + sVar3 * 8) + 8)) {
          case 2:
          case 3:
            pcVar5 = (char *)(pcVar4->val).ptr;
            fmt = "    %ld";
            goto LAB_00116234;
          case 4:
          case 5:
            err_msg(ERR_INFO,(char *)0x0,0,"    %e",(pcVar4->val).ptr);
            break;
          default:
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                    ,0xf3,"Unknown argument type: %d\n");
            break;
          case 8:
          case 9:
            pcVar5 = (char *)(pcVar4->val).ptr;
            goto LAB_0011621b;
          case 0x10:
          case 0x11:
            pcVar5 = "yes";
            if ((pcVar4->val).ptr == (void *)0x0) {
              pcVar5 = "no";
            }
            goto LAB_00116224;
          }
        }
      }
      else {
        pcVar5 = (char *)puVar1[3];
LAB_0011621b:
        if (pcVar5 != (char *)0x0) {
LAB_00116224:
          fmt = "    %s";
LAB_00116234:
          err_msg(ERR_INFO,(char *)0x0,0,fmt,pcVar5);
        }
      }
      err_msg(ERR_INFO,(char *)0x0,0,"\n");
      sVar3 = sVar3 + 1;
    } while (n_elem != sVar3);
  }
  ckd_free(__base);
  err_msg(ERR_INFO,(char *)0x0,0,"\n");
  return;
}

Assistant:

static void
arg_log_r(ps_config_t *cmdln, const ps_arg_t * defn, int32 doc, int32 lineno)
{
    ps_arg_t const **pos;
    int32 i, n;
    int32 namelen, deflen;
    cmd_ln_val_t const *vp;

    /* No definitions, do nothing. */
    if (defn == NULL)
        return;

    /* Find max lengths of name and default value fields, and #entries in defn */
    n = arg_strlen(defn, &namelen, &deflen);
    namelen += 4;
    deflen += 4;
    if (lineno)
        E_INFO("%-*s", namelen, "[NAME]");
    else
        E_INFOCONT("%-*s", namelen, "[NAME]");
    E_INFOCONT("%-*s", deflen, "[DEFLT]");
    if (doc) {
        E_INFOCONT("     [DESCR]\n");
    }
    else {
        E_INFOCONT("    [VALUE]\n");
    }

    /* Print current configuration, sorted by name */
    pos = arg_sort(defn, n);
    for (i = 0; i < n; i++) {
        if (lineno)
            E_INFO("-%-*s", namelen, pos[i]->name);
        else
            E_INFOCONT("-%-*s", namelen, pos[i]->name);
        if (pos[i]->deflt)
            E_INFOCONT("%-*s", deflen, pos[i]->deflt);
        else
            E_INFOCONT("%-*s", deflen, "");
        if (doc) {
            if (pos[i]->doc)
                E_INFOCONT("    %s", pos[i]->doc);
        }
        else {
            vp = cmd_ln_access_r(cmdln, pos[i]->name);
            if (vp) {
                switch (pos[i]->type) {
                case ARG_INTEGER:
                case REQARG_INTEGER:
                    E_INFOCONT("    %ld", vp->val.i);
                    break;
                case ARG_FLOATING:
                case REQARG_FLOATING:
                    E_INFOCONT("    %e", vp->val.fl);
                    break;
                case ARG_STRING:
                case REQARG_STRING:
                    if (vp->val.ptr)
                        E_INFOCONT("    %s", (char *)vp->val.ptr);
                    break;
                case ARG_BOOLEAN:
                case REQARG_BOOLEAN:
                    E_INFOCONT("    %s", vp->val.i ? "yes" : "no");
                    break;
                default:
                    E_ERROR("Unknown argument type: %d\n", pos[i]->type);
                }
            }
        }

        E_INFOCONT("\n");
    }
    ckd_free(pos);
    E_INFOCONT("\n");
}